

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O0

void __thiscall mp::NameProvider::ReadNames(NameProvider *this,CStringRef filename,size_t num_items)

{
  vector<const_char_*,_std::allocator<const_char_*>_> *this_00;
  StringRef last_name;
  SystemError *anon_var_0;
  NameHandler handler;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_ffffffffffffff78;
  NameHandler *in_stack_ffffffffffffff80;
  char *local_60;
  char *__n;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_ffffffffffffffb0;
  NameHandler *in_stack_ffffffffffffffd0;
  NameReader *in_stack_ffffffffffffffd8;
  CStringRef in_stack_ffffffffffffffe0;
  
  __n = local_60;
  ::internal::NameHandler::NameHandler(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            (in_stack_ffffffffffffffb0,(size_type)__n);
  internal::NameReader::Read<internal::NameHandler>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd0);
  _local_60 = ::internal::NameHandler::name((NameHandler *)&stack0xffffffffffffffd0);
  this_00 = (vector<const_char_*,_std::allocator<const_char_*>_> *)
            fmt::BasicStringRef<char>::data((BasicStringRef<char> *)&local_60);
  fmt::BasicStringRef<char>::size((BasicStringRef<char> *)&local_60);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            (this_00,(value_type *)in_stack_ffffffffffffff78);
  return;
}

Assistant:

void mp::NameProvider::ReadNames(
    fmt::CStringRef filename, std::size_t num_items) {
  ::internal::NameHandler handler(names_);
  names_.reserve(num_items + 1);
  try {
    reader_.Read(filename, handler);
  } catch (const fmt::SystemError &) {
    return; // System error, ignore the file and use generated names.
  }
  fmt::StringRef last_name = handler.name();
  names_.push_back(last_name.data() + last_name.size() + 1);
}